

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O0

Gli_Man_t * Gli_ManAlloc(int nObjs,int nRegs,int nFanioPairs)

{
  Gli_Man_t *pGVar1;
  Vec_Int_t *pVVar2;
  Gli_Man_t *p;
  int nFanioPairs_local;
  int nRegs_local;
  int nObjs_local;
  
  pGVar1 = (Gli_Man_t *)calloc((long)nObjs * 8 + 0x14 + (long)(nFanioPairs << 1),4);
  pGVar1->nRegs = nRegs;
  pVVar2 = Vec_IntAlloc(1000);
  pGVar1->vCis = pVVar2;
  pVVar2 = Vec_IntAlloc(1000);
  pGVar1->vCos = pVVar2;
  pVVar2 = Vec_IntAlloc(1000);
  pGVar1->vCisChanged = pVVar2;
  pVVar2 = Vec_IntAlloc(1000);
  pGVar1->vAffected = pVVar2;
  pVVar2 = Vec_IntAlloc(1000);
  pGVar1->vFrontier = pVVar2;
  pGVar1->nObjData = nObjs * 8 + nFanioPairs * 2;
  pGVar1->pObjData = (int *)(pGVar1 + 1);
  return pGVar1;
}

Assistant:

Gli_Man_t * Gli_ManAlloc( int nObjs, int nRegs, int nFanioPairs )
{
    Gli_Man_t * p;
    p = (Gli_Man_t *)ABC_CALLOC( int, (sizeof(Gli_Man_t) / 4) + (sizeof(Gli_Obj_t) / 4) * nObjs + 2 * nFanioPairs );
    p->nRegs = nRegs;
    p->vCis = Vec_IntAlloc( 1000 );
    p->vCos = Vec_IntAlloc( 1000 );
    p->vCisChanged = Vec_IntAlloc( 1000 );
    p->vAffected = Vec_IntAlloc( 1000 );
    p->vFrontier = Vec_IntAlloc( 1000 );
    p->nObjData = (sizeof(Gli_Obj_t) / 4) * nObjs + 2 * nFanioPairs;
    p->pObjData = (int *)(p + 1);
    return p;
}